

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

bool __thiscall
wallet::LegacyScriptPubKeyMan::AddCryptedKey
          (LegacyScriptPubKeyMan *this,CPubKey *vchPubKey,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *vchCryptedSecret)

{
  long lVar1;
  bool bVar2;
  mapped_type *vchPubKey_00;
  CKeyMetadata *keyMeta;
  CPubKey *in_RDX;
  key_type *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock24;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  WalletDatabase *in_stack_ffffffffffffff10;
  undefined6 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1e;
  undefined1 in_stack_ffffffffffffff1f;
  key_type *in_stack_ffffffffffffff28;
  CPubKey *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  CKeyMetadata *in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  LegacyDataSPKM *in_stack_ffffffffffffff50;
  WalletBatch *in_stack_ffffffffffffff58;
  WalletBatch *this_00;
  undefined1 local_51;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = LegacyDataSPKM::AddCryptedKeyInner
                    (in_stack_ffffffffffffff50,
                     (CPubKey *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_ffffffffffffff40);
  if (bVar2) {
    MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
              ((AnnotatedMixin<std::recursive_mutex> *)
               CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
               CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
               (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff40,
               in_stack_ffffffffffffff38,(char *)in_stack_ffffffffffffff30,
               (int)((ulong)in_stack_ffffffffffffff28 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffffff28 >> 0x18,0));
    if (*(long *)(in_RDI + 0x328) == 0) {
      keyMeta = (CKeyMetadata *)(**(code **)(**(long **)(in_RDI + 8) + 0x18))();
      WalletBatch::WalletBatch
                ((WalletBatch *)
                 CONCAT17(in_stack_ffffffffffffff1f,
                          CONCAT16(in_stack_ffffffffffffff1e,in_stack_ffffffffffffff18)),
                 in_stack_ffffffffffffff10,(bool)in_stack_ffffffffffffff0f);
      CPubKey::GetID(in_RDX);
      std::
      map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
      ::operator[]((map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
                    *)in_RDX,in_RSI);
      local_51 = WalletBatch::WriteCryptedKey
                           (in_stack_ffffffffffffff58,(CPubKey *)in_stack_ffffffffffffff50,
                            (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                            CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),keyMeta);
      WalletBatch::~WalletBatch
                ((WalletBatch *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
    }
    else {
      this_00 = *(WalletBatch **)(in_RDI + 0x328);
      CPubKey::GetID(in_stack_ffffffffffffff30);
      vchPubKey_00 = std::
                     map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
                     ::operator[]((map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
                                   *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      local_51 = WalletBatch::WriteCryptedKey
                           (this_00,(CPubKey *)vchPubKey_00,
                            (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                            CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                            in_stack_ffffffffffffff40);
    }
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
               CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
  }
  else {
    local_51 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_51;
  }
  __stack_chk_fail();
}

Assistant:

bool LegacyScriptPubKeyMan::AddCryptedKey(const CPubKey &vchPubKey,
                            const std::vector<unsigned char> &vchCryptedSecret)
{
    if (!AddCryptedKeyInner(vchPubKey, vchCryptedSecret))
        return false;
    {
        LOCK(cs_KeyStore);
        if (encrypted_batch)
            return encrypted_batch->WriteCryptedKey(vchPubKey,
                                                        vchCryptedSecret,
                                                        mapKeyMetadata[vchPubKey.GetID()]);
        else
            return WalletBatch(m_storage.GetDatabase()).WriteCryptedKey(vchPubKey,
                                                            vchCryptedSecret,
                                                            mapKeyMetadata[vchPubKey.GetID()]);
    }
}